

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldConvertors.h
# Opt level: O0

string * __thiscall
FIX::IntConvertor::convert_abi_cxx11_
          (string *__return_storage_ptr__,IntConvertor *this,signed_int value)

{
  char *pcVar1;
  allocator local_29;
  char *local_28;
  char *start;
  char buffer [11];
  signed_int value_local;
  
  buffer._3_4_ = SUB84(this,0);
  unique0x100000ac = __return_storage_ptr__;
  pcVar1 = integer_to_string((char *)((long)&start + 1),0xb,buffer._3_4_);
  local_28 = pcVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)__return_storage_ptr__,pcVar1,(ulong)(buffer + (3 - (long)pcVar1)),&local_29)
  ;
  std::allocator<char>::~allocator((allocator<char> *)&local_29);
  return __return_storage_ptr__;
}

Assistant:

static std::string convert( signed_int value )
  {
    // buffer is big enough for significant digits and extra digit,
    // minus and null
    char buffer[std::numeric_limits<signed_int>::digits10 + 2];
    const char* const start
      = integer_to_string( buffer, sizeof (buffer), value );
    return std::string( start, buffer + sizeof (buffer) - start );
  }